

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O3

ssize_t __thiscall
capnp::LocalRequest::send(LocalRequest *this,int __fd,void *__buf,size_t __n,int __flags)

{
  undefined2 uVar1;
  undefined8 uVar2;
  long *plVar3;
  Event **ppEVar4;
  Disposer *pDVar5;
  EventLoop *pEVar6;
  ExceptionOrValue *pEVar7;
  PromiseNode *pPVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  EventLoop *pEVar11;
  undefined4 in_register_00000034;
  long lVar12;
  Refcounted *refcounted;
  anon_union_344_1_a8c68091_for_NullableValue<kj::Exception>_2 *paVar13;
  Own<kj::_::TransformPromiseNode<capnp::Response<capnp::AnyPointer>,_kj::_::Void,_kj::CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_c__:215:9),_kj::Own<capnp::LocalCallContext>_>,_kj::_::PropagateException>_>
  OVar14;
  ForkedPromise<void> forked;
  Fault f;
  undefined1 local_f8 [8];
  Disposer *local_f0;
  LocalCallContext *local_e8;
  EventLoop *pEStack_e0;
  EventLoop *local_d8;
  undefined4 local_c8 [2];
  undefined8 uStack_c0;
  MallocMessageBuilder *local_b8;
  ExceptionOrValue *pEStack_b0;
  Own<kj::_::PromiseNode> local_a8;
  undefined1 local_98 [16];
  Promise<void> local_88;
  Own<kj::_::PromiseNode> local_78 [4];
  
  lVar12 = CONCAT44(in_register_00000034,__fd);
  if (*(long *)(lVar12 + 0x10) != 0) {
    uVar2 = *(undefined8 *)(lVar12 + 0x18);
    uVar1 = *(undefined2 *)(lVar12 + 0x20);
    kj::newPromiseAndFulfiller<void>();
    (**(code **)(**(long **)(lVar12 + 0x30) + 0x20))(local_c8);
    pEVar11 = (EventLoop *)operator_new(0xa8);
    paVar13 = (anon_union_344_1_a8c68091_for_NullableValue<kj::Exception>_2 *)&pEVar11->running;
    *(undefined ***)&((Maybe<kj::Exception> *)&pEVar11->port)->ptr = &PTR_getParams_0061e9f8;
    (((anon_union_344_1_a8c68091_for_NullableValue<kj::Exception>_2 *)&pEVar11->running)->value).
    ownFile.content.ptr = (char *)&PTR_disposeImpl_0061ea58;
    ppEVar4 = *(Event ***)(lVar12 + 0x10);
    pEVar11->tail = *(Event ***)(lVar12 + 8);
    pEVar11->depthFirstInsertPoint = ppEVar4;
    *(undefined8 *)(lVar12 + 0x10) = 0;
    *(undefined1 *)&(pEVar11->daemons).disposer = 0;
    pEVar11[1].daemons.disposer = (Disposer *)0x0;
    pEVar11[1].daemons.ptr = (TaskSet *)0x0;
    pEVar11[2].port = (EventPort *)0x0;
    pEVar11[2].running = local_c8[0]._0_1_;
    pEVar11[2].lastRunnableState = (bool)local_c8[0]._1_1_;
    *(undefined2 *)&pEVar11[2].field_0xa = local_c8[0]._2_2_;
    *(undefined4 *)&pEVar11[2].field_0xc = local_c8[1];
    *(undefined4 *)&pEVar11[2].head = (undefined4)uStack_c0;
    *(undefined4 *)((long)&pEVar11[2].head + 4) = uStack_c0._4_4_;
    pEVar11[2].tail = (Event **)0x0;
    pEVar11[2].depthFirstInsertPoint = (Event **)0x0;
    uVar9 = local_78[1].ptr._0_4_;
    uVar10 = local_78[1].ptr._4_4_;
    local_78[1].ptr = (PromiseNode *)0x0;
    *(undefined4 *)&pEVar11[2].daemons.disposer = local_78[1].disposer._0_4_;
    *(undefined4 *)((long)&pEVar11[2].daemons.disposer + 4) = local_78[1].disposer._4_4_;
    *(undefined4 *)&pEVar11[2].daemons.ptr = uVar9;
    *(undefined4 *)((long)&pEVar11[2].daemons.ptr + 4) = uVar10;
    plVar3 = *(long **)(lVar12 + 0x30);
    *(undefined4 *)&pEVar11->head = 2;
    local_e8 = (LocalCallContext *)paVar13;
    pEStack_e0 = pEVar11;
    (**(code **)(*plVar3 + 8))(local_c8,plVar3,uVar2,uVar1);
    pEVar6 = pEStack_e0;
    if (pEStack_e0 != (EventLoop *)0x0) {
      pEStack_e0 = (EventLoop *)0x0;
      (**(code **)(((String *)&local_e8->super_CallContextHook)->content).ptr)
                (local_e8,&(((Maybe<kj::Exception> *)&pEVar6->port)->ptr).isSet +
                          *(long *)(*(long *)&((Maybe<kj::Exception> *)&pEVar6->port)->ptr + -0x10))
      ;
    }
    kj::Promise<void>::fork(&local_88);
    kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)local_98);
    *(int *)&pEVar11->head = *(int *)&pEVar11->head + 1;
    local_78[2].disposer = (Disposer *)paVar13;
    local_78[2].ptr = (PromiseNode *)pEVar11;
    kj::Promise<void>::attach<kj::Own<capnp::LocalCallContext>>
              ((Promise<void> *)local_f8,(Own<capnp::LocalCallContext> *)local_98);
    kj::
    heap<kj::_::ExclusiveJoinPromiseNode,kj::Own<kj::_::PromiseNode>,kj::Own<kj::_::PromiseNode>>
              ((kj *)&local_e8,(Own<kj::_::PromiseNode> *)local_f8,local_78);
    local_a8.disposer = (Disposer *)local_e8;
    local_a8.ptr = (PromiseNode *)pEStack_e0;
    kj::Promise<void>::detach<capnp::LocalRequest::send()::_lambda(kj::Exception&&)_1_>
              ((Promise<void> *)&local_a8,(anon_class_1_0_00000001_for_errorHandler *)&local_e8);
    pPVar8 = local_a8.ptr;
    if ((EventLoop *)local_a8.ptr != (EventLoop *)0x0) {
      local_a8.ptr = (PromiseNode *)0x0;
      (**(code **)(((String *)&(local_a8.disposer)->_vptr_Disposer)->content).ptr)
                (local_a8.disposer,
                 &(((Maybe<kj::Exception> *)&pPVar8->_vptr_PromiseNode)->ptr).isSet +
                 *(long *)(*(long *)&((Maybe<kj::Exception> *)&pPVar8->_vptr_PromiseNode)->ptr +
                          -0x10));
    }
    pDVar5 = local_f0;
    if (local_f0 != (Disposer *)0x0) {
      local_f0 = (Disposer *)0x0;
      (***(_func_int ***)local_f8)
                (local_f8,pDVar5->_vptr_Disposer[-2] + (long)&pDVar5->_vptr_Disposer);
    }
    pPVar8 = local_78[2].ptr;
    if ((EventLoop *)local_78[2].ptr != (EventLoop *)0x0) {
      local_78[2].ptr = (PromiseNode *)0x0;
      (**(_func_int **)(((String *)&(local_78[2].disposer)->_vptr_Disposer)->content).ptr)
                (local_78[2].disposer,
                 &(((Maybe<kj::Exception> *)&pPVar8->_vptr_PromiseNode)->ptr).isSet +
                 *(long *)(*(long *)&((Maybe<kj::Exception> *)&pPVar8->_vptr_PromiseNode)->ptr +
                          -0x10));
    }
    uVar2 = local_98._8_8_;
    if ((LocalCallContext *)local_98._8_8_ != (LocalCallContext *)0x0) {
      local_98._8_8_ = (LocalCallContext *)0x0;
      (**(code **)*(_func_int **)local_98._0_8_)
                (local_98._0_8_,(char *)(uVar2 + *(long *)(*(long *)uVar2 + -0x10)));
    }
    kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)local_f8);
    pEStack_e0 = (EventLoop *)paVar13;
    local_d8 = pEVar11;
    OVar14 = kj::
             heap<kj::_::TransformPromiseNode<capnp::Response<capnp::AnyPointer>,kj::_::Void,kj::CaptureByMove<capnp::LocalRequest::send()::_lambda(kj::Own<capnp::LocalCallContext>&&)_1_,kj::Own<capnp::LocalCallContext>>,kj::_::PropagateException>,kj::Own<kj::_::PromiseNode>,kj::CaptureByMove<capnp::LocalRequest::send()::_lambda(kj::Own<capnp::LocalCallContext>&&)_1_,kj::Own<capnp::LocalCallContext>>,kj::_::PropagateException>
                       (&local_a8,
                        (CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_c__:215:9),_kj::Own<capnp::LocalCallContext>_>
                         *)local_f8,(PropagateException *)&local_e8);
    pEVar6 = local_d8;
    local_78[3].disposer._0_4_ = local_a8.disposer._0_4_;
    local_78[3].disposer._4_4_ = local_a8.disposer._4_4_;
    local_78[3].ptr._0_4_ = local_a8.ptr._0_4_;
    local_78[3].ptr._4_4_ = local_a8.ptr._4_4_;
    if (local_d8 != (EventLoop *)0x0) {
      local_d8 = (EventLoop *)0x0;
      (**(code **)(((String *)&pEStack_e0->port)->content).ptr)
                (pEStack_e0,
                 &(((Maybe<kj::Exception> *)&pEVar6->port)->ptr).isSet +
                 *(long *)(*(long *)&((Maybe<kj::Exception> *)&pEVar6->port)->ptr + -0x10),
                 OVar14.ptr);
    }
    pDVar5 = local_f0;
    if (local_f0 != (Disposer *)0x0) {
      local_f0 = (Disposer *)0x0;
      (***(_func_int ***)local_f8)
                (local_f8,pDVar5->_vptr_Disposer[-2] + (long)&pDVar5->_vptr_Disposer);
    }
    pPVar8 = local_88.super_PromiseBase.node.ptr;
    pEVar7 = pEStack_b0;
    (this->super_RequestHook)._vptr_RequestHook =
         (_func_int **)CONCAT44(local_78[3].disposer._4_4_,local_78[3].disposer._0_4_);
    (this->message).disposer = (Disposer *)CONCAT44(local_78[3].ptr._4_4_,local_78[3].ptr._0_4_);
    pEStack_b0 = (ExceptionOrValue *)0x0;
    (this->message).ptr = local_b8;
    this->interfaceId = (uint64_t)pEVar7;
    *(undefined8 *)&this->methodId = 0;
    (this->client).disposer = (Disposer *)0x0;
    (this->client).ptr = (ClientHook *)0x0;
    if ((EventLoop *)local_88.super_PromiseBase.node.ptr != (EventLoop *)0x0) {
      local_88.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      (**(local_88.super_PromiseBase.node.disposer)->_vptr_Disposer)
                (local_88.super_PromiseBase.node.disposer,
                 (_func_int *)
                 ((long)((EventPort *)pPVar8->_vptr_PromiseNode)[-2]._vptr_EventPort +
                 (long)&pPVar8->_vptr_PromiseNode));
      pEVar7 = pEStack_b0;
      if (pEStack_b0 != (ExceptionOrValue *)0x0) {
        pEStack_b0 = (ExceptionOrValue *)0x0;
        (**(local_b8->super_MessageBuilder)._vptr_MessageBuilder)
                  (local_b8,&(pEVar7->exception).ptr.isSet +
                            *(long *)(*(long *)&(pEVar7->exception).ptr + -0x10));
      }
    }
    pDVar5 = uStack_c0;
    if (uStack_c0 != (Disposer *)0x0) {
      uStack_c0 = (Disposer *)0x0;
      (*(code *)**(undefined8 **)CONCAT44(local_c8[1],local_c8[0]))
                ((undefined8 *)CONCAT44(local_c8[1],local_c8[0]),
                 pDVar5->_vptr_Disposer[-2] + (long)&pDVar5->_vptr_Disposer);
    }
    pPVar8 = local_78[1].ptr;
    if ((Disposer *)local_78[1].ptr != (Disposer *)0x0) {
      local_78[1].ptr = (PromiseNode *)0x0;
      (*(code *)**(undefined8 **)CONCAT44(local_78[1].disposer._4_4_,local_78[1].disposer._0_4_))
                ((undefined8 *)CONCAT44(local_78[1].disposer._4_4_,local_78[1].disposer._0_4_),
                 pPVar8->_vptr_PromiseNode[-2] + (long)pPVar8);
    }
    pPVar8 = local_78[0].ptr;
    if (local_78[0].ptr != (PromiseNode *)0x0) {
      local_78[0].ptr = (PromiseNode *)0x0;
      (*(code *)*(local_78[0].disposer)->_vptr_Disposer)
                (local_78[0].disposer,(long)pPVar8 + (long)pPVar8->_vptr_PromiseNode[-2]);
    }
    return (ssize_t)this;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[39]>
            ((Fault *)local_78,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability.c++"
             ,0xbe,FAILED,"message.get() != nullptr","\"Already called send() on this request.\"",
             (char (*) [39])"Already called send() on this request.");
  kj::_::Debug::Fault::fatal((Fault *)local_78);
}

Assistant:

RemotePromise<AnyPointer> send() override {
    KJ_REQUIRE(message.get() != nullptr, "Already called send() on this request.");

    // For the lambda capture.
    uint64_t interfaceId = this->interfaceId;
    uint16_t methodId = this->methodId;

    auto cancelPaf = kj::newPromiseAndFulfiller<void>();

    auto context = kj::refcounted<LocalCallContext>(
        kj::mv(message), client->addRef(), kj::mv(cancelPaf.fulfiller));
    auto promiseAndPipeline = client->call(interfaceId, methodId, kj::addRef(*context));

    // We have to make sure the call is not canceled unless permitted.  We need to fork the promise
    // so that if the client drops their copy, the promise isn't necessarily canceled.
    auto forked = promiseAndPipeline.promise.fork();

    // We daemonize one branch, but only after joining it with the promise that fires if
    // cancellation is allowed.
    forked.addBranch()
        .attach(kj::addRef(*context))
        .exclusiveJoin(kj::mv(cancelPaf.promise))
        .detach([](kj::Exception&&) {});  // ignore exceptions

    // Now the other branch returns the response from the context.
    auto promise = forked.addBranch().then(kj::mvCapture(context,
        [](kj::Own<LocalCallContext>&& context) {
      context->getResults(MessageSize { 0, 0 });  // force response allocation
      return kj::mv(KJ_ASSERT_NONNULL(context->response));
    }));

    // We return the other branch.
    return RemotePromise<AnyPointer>(
        kj::mv(promise), AnyPointer::Pipeline(kj::mv(promiseAndPipeline.pipeline)));
  }